

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRigidBody.cpp
# Opt level: O1

void __thiscall
btRigidBody::btRigidBody
          (btRigidBody *this,btScalar mass,btMotionState *motionState,
          btCollisionShape *collisionShape,btVector3 *localInertia)

{
  btRigidBodyConstructionInfo local_b8;
  
  btCollisionObject::btCollisionObject(&this->super_btCollisionObject);
  (this->super_btCollisionObject)._vptr_btCollisionObject = (_func_int **)&PTR__btRigidBody_00228a68
  ;
  (this->m_constraintRefs).m_ownsMemory = true;
  (this->m_constraintRefs).m_data = (btTypedConstraint **)0x0;
  (this->m_constraintRefs).m_size = 0;
  (this->m_constraintRefs).m_capacity = 0;
  local_b8.m_localInertia.m_floats._0_8_ = *(undefined8 *)localInertia->m_floats;
  local_b8.m_localInertia.m_floats._8_8_ = *(undefined8 *)(localInertia->m_floats + 2);
  local_b8.m_linearDamping = 0.0;
  local_b8.m_angularDamping = 0.0;
  local_b8.m_friction = 0.5;
  local_b8.m_rollingFriction = 0.0;
  local_b8.m_restitution = 0.0;
  local_b8.m_linearSleepingThreshold = 0.8;
  local_b8.m_angularSleepingThreshold = 1.0;
  local_b8.m_additionalDamping = false;
  local_b8.m_additionalDampingFactor = 0.005;
  local_b8.m_additionalLinearDampingThresholdSqr = 0.01;
  local_b8.m_additionalAngularDampingThresholdSqr = 0.01;
  local_b8.m_additionalAngularDampingFactor = 0.01;
  local_b8.m_startWorldTransform.m_basis.m_el[0].m_floats[0] = 1.0;
  local_b8.m_startWorldTransform.m_basis.m_el[0].m_floats[1] = 0.0;
  local_b8.m_startWorldTransform.m_basis.m_el[0].m_floats[2] = 0.0;
  local_b8.m_startWorldTransform.m_basis.m_el[0].m_floats[3] = 0.0;
  local_b8.m_startWorldTransform.m_basis.m_el[1].m_floats[0] = 0.0;
  local_b8.m_startWorldTransform.m_basis.m_el[1].m_floats[1] = 1.0;
  local_b8.m_startWorldTransform.m_basis.m_el[1].m_floats[2] = 0.0;
  local_b8.m_startWorldTransform.m_basis.m_el[1].m_floats[3] = 0.0;
  local_b8.m_startWorldTransform.m_basis.m_el[2].m_floats[0] = 0.0;
  local_b8.m_startWorldTransform.m_basis.m_el[2].m_floats[1] = 0.0;
  local_b8.m_startWorldTransform.m_basis.m_el[2].m_floats[2] = 1.0;
  local_b8.m_startWorldTransform.m_basis.m_el[2].m_floats[3] = 0.0;
  local_b8.m_startWorldTransform.m_origin.m_floats[0] = 0.0;
  local_b8.m_startWorldTransform.m_origin.m_floats[1] = 0.0;
  local_b8.m_startWorldTransform.m_origin.m_floats[2] = 0.0;
  local_b8.m_startWorldTransform.m_origin.m_floats[3] = 0.0;
  local_b8.m_mass = mass;
  local_b8.m_motionState = motionState;
  local_b8.m_collisionShape = collisionShape;
  setupRigidBody(this,&local_b8);
  return;
}

Assistant:

btRigidBody::btRigidBody(btScalar mass, btMotionState *motionState, btCollisionShape *collisionShape, const btVector3 &localInertia)
{
	btRigidBodyConstructionInfo cinfo(mass,motionState,collisionShape,localInertia);
	setupRigidBody(cinfo);
}